

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::
back_propagate_error
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this,
          tensor *x,tensor *gradient_input,zero_gradients zero_grads)

{
  resizable_tensor *this_00;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  subnet_wrapper wsub;
  subnet_wrapper local_48;
  
  this_00 = &this->grad_final;
  if ((((x->m_n != (this->grad_final).super_tensor.m_n) ||
       (x->m_k != (this->grad_final).super_tensor.m_k)) ||
      (x->m_nr != (this->grad_final).super_tensor.m_nr)) ||
     (x->m_nc != (this->grad_final).super_tensor.m_nc)) {
    resizable_tensor::copy_size(this_00,x);
  }
  iVar2 = (*(this->grad_final).super_tensor._vptr_tensor[4])(this_00);
  lVar1 = (this->grad_final).super_tensor.m_size;
  if (lVar1 != 0) {
    memset((void *)CONCAT44(extraout_var,iVar2),0,lVar1 << 2);
  }
  local_48._sample_expansion_factor = this->_sample_expansion_factor;
  local_48.x = x;
  local_48.grad_final = this_00;
  resizable_tensor::copy_size(&this->params_grad,(tensor *)&this->details);
  con_<64l,7l,7l,2,2,0,0>::
  backward<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::subnet_wrapper>
            ((con_<64l,7l,7l,2,2,0,0> *)&this->details,gradient_input,&local_48,
             &(this->params_grad).super_tensor);
  this->gradient_input_is_stale = zero_grads == yes;
  return;
}

Assistant:

void back_propagate_error(
            const tensor& x,
            const tensor& gradient_input,
            zero_gradients zero_grads = zero_gradients::yes
        )
        {
            // make sure grad_final is initialized to 0
            if (!have_same_dimensions(x, grad_final))
                grad_final.copy_size(x);
            grad_final = 0;  

            subnet_wrapper wsub(x, grad_final, _sample_expansion_factor);
            params_grad.copy_size(details.get_layer_params());
            impl::call_layer_backward(details, private_get_output(),
                gradient_input, wsub, static_cast<tensor&>(params_grad));

            // zero out get_gradient_input()
            gradient_input_is_stale = zero_grads == zero_gradients::yes;
        }